

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOFileData.h
# Opt level: O3

void __thiscall Assimp::LWO::VMapEntry::~VMapEntry(VMapEntry *this)

{
  pointer pfVar1;
  pointer pcVar2;
  
  this->_vptr_VMapEntry = (_func_int **)&PTR__VMapEntry_008e6e38;
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&(this->abAssigned).super__Bvector_base<std::allocator<bool>_>);
  pfVar1 = (this->rawData).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pfVar1 != (pointer)0x0) {
    operator_delete(pfVar1);
  }
  pcVar2 = (this->name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->name).field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

virtual ~VMapEntry() {}